

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGClient.cpp
# Opt level: O3

void __thiscall
ViconCGStreamClientSDK::VCGClient::ReceiveMulticastData
          (VCGClient *this,string *i_MulticastIPAddress,string *i_LocalIPAddress,
          unsigned_short i_Port)

{
  VViconCGStreamClient *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  pointer pcVar1;
  pointer psVar2;
  pointer psVar3;
  scoped_lock Lock;
  unique_lock<boost::recursive_mutex> local_90;
  VCGClient *local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  local_90.m = &this->m_ClientMutex;
  local_90.is_locked = false;
  boost::unique_lock<boost::recursive_mutex>::lock(&local_90);
  psVar2 = (this->m_pClients).
           super__Vector_base<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_78 = (this->m_pClients).
             super__Vector_base<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  psVar3 = psVar2;
  if (psVar2 != local_78) {
    local_80 = this;
    do {
      this_00 = (psVar2->super___shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr;
      this_01 = (psVar2->super___shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2>).
                _M_refcount._M_pi;
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_01->_M_use_count = this_01->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_01->_M_use_count = this_01->_M_use_count + 1;
        }
      }
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      pcVar1 = (i_MulticastIPAddress->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + i_MulticastIPAddress->_M_string_length);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      pcVar1 = (i_LocalIPAddress->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,pcVar1,pcVar1 + i_LocalIPAddress->_M_string_length);
      VViconCGStreamClient::ReceiveMulticastData(this_00,&local_70,&local_50,i_Port);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p);
      }
      if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
      }
      psVar2 = psVar2 + 1;
    } while (psVar2 != local_78);
    psVar2 = (local_80->m_pClients).
             super__Vector_base<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (local_80->m_pClients).
             super__Vector_base<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    this = local_80;
  }
  this->m_bMulticastReceiving = psVar2 != psVar3;
  if (local_90.is_locked == true) {
    boost::recursive_mutex::unlock(local_90.m);
  }
  return;
}

Assistant:

void VCGClient::ReceiveMulticastData( std::string i_MulticastIPAddress, std::string i_LocalIPAddress, unsigned short i_Port )
{
  boost::recursive_mutex::scoped_lock Lock( m_ClientMutex );

  for (auto pClient : m_pClients)
  {
    pClient->ReceiveMulticastData(i_MulticastIPAddress, i_LocalIPAddress, i_Port);
  }

  m_bMulticastReceiving = !m_pClients.empty();
}